

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

void finish_pass_huff(j_compress_ptr cinfo)

{
  jpeg_entropy_encoder *pjVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_destination_mgr *pjVar3;
  boolean bVar4;
  working_state state;
  undefined1 local_58 [32];
  _func_void_j_compress_ptr *local_38;
  _func_void_j_compress_ptr_boolean *p_Stack_30;
  j_compress_ptr local_28;
  int local_20;
  
  pjVar1 = cinfo->entropy;
  local_58._0_8_ = cinfo->dest->next_output_byte;
  local_58._8_8_ = cinfo->dest->free_in_buffer;
  local_58._16_8_ = *(anon_union_8_2_c960f3a9_for_put_buffer *)(pjVar1 + 1);
  local_58._24_8_ = pjVar1[1].encode_mcu;
  local_38 = pjVar1[1].finish_pass;
  p_Stack_30 = pjVar1[2].start_pass;
  local_20 = *(int *)&pjVar1[8].start_pass;
  local_28 = cinfo;
  bVar4 = flush_bits((working_state *)local_58);
  if (bVar4 == 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x18;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  pjVar3 = cinfo->dest;
  pjVar3->next_output_byte = (JOCTET *)local_58._0_8_;
  pjVar3->free_in_buffer = local_58._8_8_;
  pjVar1[1].finish_pass = local_38;
  pjVar1[2].start_pass = p_Stack_30;
  *(undefined8 *)(pjVar1 + 1) = local_58._16_8_;
  pjVar1[1].encode_mcu = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)local_58._24_8_;
  return;
}

Assistant:

METHODDEF(void)
finish_pass_huff(j_compress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  working_state state;

  /* Load up working state ... flush_bits needs it */
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  state.cur = entropy->saved;
  state.cinfo = cinfo;
  state.simd = entropy->simd;

  /* Flush out the last data */
  if (!flush_bits(&state))
    ERREXIT(cinfo, JERR_CANT_SUSPEND);

  /* Update state */
  cinfo->dest->next_output_byte = state.next_output_byte;
  cinfo->dest->free_in_buffer = state.free_in_buffer;
  entropy->saved = state.cur;
}